

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void __thiscall VmFunction::UpdateLiveSets(VmFunction *this,VmModule *module)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  VmBlock **ppVVar4;
  VmInstruction **ppVVar5;
  VmValue **ppVVar6;
  SmallArray<VmInstruction_*,_4U> *pSVar7;
  VmBlock *local_1b8;
  VmBlock *predecessor;
  VmInstruction *pVStack_1a8;
  uint i_2;
  VmInstruction *argument_1;
  VmInstruction *pVStack_198;
  uint i_1;
  VmInstruction *inst;
  uint i;
  uint liveInSize;
  VmBlock *edge;
  VmInstruction *instruction;
  uint argument;
  bool found;
  VmInstruction *liveIn;
  VmBlock *pVStack_160;
  uint k;
  VmBlock *successor;
  VmBlock *pVStack_150;
  uint successorPos;
  VmBlock *curr_1;
  VmBlock *local_138;
  VmBlock *curr;
  SmallArray<VmBlock_*,_32U> worklist;
  VmModule *module_local;
  VmFunction *this_local;
  
  worklist.allocator = (Allocator *)module;
  SmallArray<VmBlock_*,_32U>::SmallArray((SmallArray<VmBlock_*,_32U> *)&curr,module->allocator);
  for (local_138 = this->firstBlock; local_138 != (VmBlock *)0x0; local_138 = local_138->nextSibling
      ) {
    SmallArray<VmInstruction_*,_4U>::clear(&local_138->liveIn);
    SmallArray<VmInstruction_*,_4U>::clear(&local_138->liveOut);
    SmallArray<VmBlock_*,_32U>::push_back((SmallArray<VmBlock_*,_32U> *)&curr,&local_138);
  }
  do {
    bVar2 = SmallArray<VmBlock_*,_32U>::empty((SmallArray<VmBlock_*,_32U> *)&curr);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      SmallArray<VmBlock_*,_32U>::~SmallArray((SmallArray<VmBlock_*,_32U> *)&curr);
      return;
    }
    ppVVar4 = SmallArray<VmBlock_*,_32U>::back((SmallArray<VmBlock_*,_32U> *)&curr);
    pVStack_150 = *ppVVar4;
    SmallArray<VmBlock_*,_32U>::pop_back((SmallArray<VmBlock_*,_32U> *)&curr);
    SmallArray<VmInstruction_*,_4U>::clear(&pVStack_150->liveOut);
    for (successor._4_4_ = 0; uVar1 = successor._4_4_,
        uVar3 = SmallArray<VmBlock_*,_4U>::size(&pVStack_150->successors), uVar1 < uVar3;
        successor._4_4_ = successor._4_4_ + 1) {
      ppVVar4 = SmallArray<VmBlock_*,_4U>::operator[](&pVStack_150->successors,successor._4_4_);
      pVStack_160 = *ppVVar4;
      for (liveIn._4_4_ = 0; uVar1 = liveIn._4_4_,
          uVar3 = SmallArray<VmInstruction_*,_4U>::size(&pVStack_160->liveIn), uVar1 < uVar3;
          liveIn._4_4_ = liveIn._4_4_ + 1) {
        ppVVar5 = SmallArray<VmInstruction_*,_4U>::operator[](&pVStack_160->liveIn,liveIn._4_4_);
        _argument = *ppVVar5;
        instruction._7_1_ = 0;
        if (_argument->cmd == VM_INST_PHI) {
          for (instruction._0_4_ = 0; uVar1 = (uint)instruction,
              uVar3 = SmallArray<VmValue_*,_4U>::size(&_argument->arguments), uVar1 < uVar3;
              instruction._0_4_ = (uint)instruction + 2) {
            ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&_argument->arguments,(uint)instruction)
            ;
            edge = (VmBlock *)getType<VmInstruction>(*ppVVar6);
            ppVVar6 = SmallArray<VmValue_*,_4U>::operator[]
                                (&_argument->arguments,(uint)instruction + 1);
            _i = getType<VmBlock>(*ppVVar6);
            if (_i == pVStack_150) {
              bVar2 = SmallArray<VmInstruction_*,_4U>::contains
                                (&pVStack_150->liveOut,(VmInstruction **)&edge);
              if (!bVar2) {
                SmallArray<VmInstruction_*,_4U>::push_back
                          (&pVStack_150->liveOut,(VmInstruction **)&edge);
              }
              instruction._7_1_ = 1;
            }
          }
          if (((instruction._7_1_ & 1) == 0) &&
             (bVar2 = SmallArray<VmInstruction_*,_4U>::contains
                                (&pVStack_150->liveOut,(VmInstruction **)&argument), !bVar2)) {
            SmallArray<VmInstruction_*,_4U>::push_back
                      (&pVStack_150->liveOut,(VmInstruction **)&argument);
          }
        }
        else {
          bVar2 = SmallArray<VmInstruction_*,_4U>::contains
                            (&pVStack_150->liveOut,(VmInstruction **)&argument);
          if (!bVar2) {
            SmallArray<VmInstruction_*,_4U>::push_back
                      (&pVStack_150->liveOut,(VmInstruction **)&argument);
          }
        }
      }
    }
    inst._4_4_ = SmallArray<VmInstruction_*,_4U>::size(&pVStack_150->liveIn);
    SmallArray<VmInstruction_*,_4U>::clear(&pVStack_150->liveIn);
    for (inst._0_4_ = 0; uVar1 = (uint)inst,
        uVar3 = SmallArray<VmInstruction_*,_4U>::size(&pVStack_150->liveOut), uVar1 < uVar3;
        inst._0_4_ = (uint)inst + 1) {
      ppVVar5 = SmallArray<VmInstruction_*,_4U>::operator[](&pVStack_150->liveOut,(uint)inst);
      if ((*ppVVar5)->parent != pVStack_150) {
        pSVar7 = &pVStack_150->liveIn;
        ppVVar5 = SmallArray<VmInstruction_*,_4U>::operator[](&pVStack_150->liveOut,(uint)inst);
        bVar2 = SmallArray<VmInstruction_*,_4U>::contains(pSVar7,ppVVar5);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          __assert_fail("!curr->liveIn.contains(curr->liveOut[i])",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x957,"void VmFunction::UpdateLiveSets(VmModule *)");
        }
        pSVar7 = &pVStack_150->liveIn;
        ppVVar5 = SmallArray<VmInstruction_*,_4U>::operator[](&pVStack_150->liveOut,(uint)inst);
        SmallArray<VmInstruction_*,_4U>::push_back(pSVar7,ppVVar5);
      }
    }
    for (pVStack_198 = pVStack_150->firstInstruction; uVar1 = inst._4_4_,
        pVStack_198 != (VmInstruction *)0x0; pVStack_198 = pVStack_198->nextSibling) {
      for (argument_1._4_4_ = 0; uVar1 = argument_1._4_4_,
          uVar3 = SmallArray<VmValue_*,_4U>::size(&pVStack_198->arguments), uVar1 < uVar3;
          argument_1._4_4_ = argument_1._4_4_ + 1) {
        ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&pVStack_198->arguments,argument_1._4_4_);
        pVStack_1a8 = getType<VmInstruction>(*ppVVar6);
        if (pVStack_1a8 != (VmInstruction *)0x0) {
          if (pVStack_198->cmd == VM_INST_PHI) {
            bVar2 = SmallArray<VmInstruction_*,_4U>::contains
                              (&pVStack_150->liveIn,&stack0xfffffffffffffe68);
            if (!bVar2) {
              SmallArray<VmInstruction_*,_4U>::push_back
                        (&pVStack_150->liveIn,&stack0xfffffffffffffe68);
            }
          }
          else if ((pVStack_1a8->parent != pVStack_150) &&
                  (bVar2 = SmallArray<VmInstruction_*,_4U>::contains
                                     (&pVStack_150->liveIn,&stack0xfffffffffffffe58), !bVar2)) {
            SmallArray<VmInstruction_*,_4U>::push_back
                      (&pVStack_150->liveIn,&stack0xfffffffffffffe58);
          }
        }
      }
    }
    uVar3 = SmallArray<VmInstruction_*,_4U>::size(&pVStack_150->liveIn);
    if (uVar1 != uVar3) {
      for (predecessor._4_4_ = 0; uVar1 = predecessor._4_4_,
          uVar3 = SmallArray<VmBlock_*,_4U>::size(&pVStack_150->predecessors), uVar1 < uVar3;
          predecessor._4_4_ = predecessor._4_4_ + 1) {
        ppVVar4 = SmallArray<VmBlock_*,_4U>::operator[]
                            (&pVStack_150->predecessors,predecessor._4_4_);
        local_1b8 = *ppVVar4;
        bVar2 = SmallArray<VmBlock_*,_32U>::contains((SmallArray<VmBlock_*,_32U> *)&curr,&local_1b8)
        ;
        if (!bVar2) {
          SmallArray<VmBlock_*,_32U>::push_back((SmallArray<VmBlock_*,_32U> *)&curr,&local_1b8);
        }
      }
    }
  } while( true );
}

Assistant:

void VmFunction::UpdateLiveSets(VmModule *module)
{
	SmallArray<VmBlock*, 32> worklist(module->allocator);

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		curr->liveIn.clear();
		curr->liveOut.clear();

		worklist.push_back(curr);
	}

	while(!worklist.empty())
	{
		VmBlock *curr = worklist.back();
		worklist.pop_back();

		// Update block liveOut list
		curr->liveOut.clear();

		for(unsigned successorPos = 0; successorPos < curr->successors.size(); successorPos++)
		{
			VmBlock *successor = curr->successors[successorPos];

			for(unsigned k = 0; k < successor->liveIn.size(); k++)
			{
				VmInstruction *liveIn = successor->liveIn[k];

				bool found = false;

				if(liveIn->cmd == VM_INST_PHI)
				{
					for(unsigned argument = 0; argument < liveIn->arguments.size(); argument += 2)
					{
						VmInstruction *instruction = getType<VmInstruction>(liveIn->arguments[argument]);
						VmBlock *edge = getType<VmBlock>(liveIn->arguments[argument + 1]);

						if(edge == curr)
						{
							if(!curr->liveOut.contains(instruction))
								curr->liveOut.push_back(instruction);

							found = true;
						}
					}

					if(!found)
					{
						if(!curr->liveOut.contains(liveIn))
							curr->liveOut.push_back(liveIn);
					}
				}
				else
				{
					if(!curr->liveOut.contains(liveIn))
						curr->liveOut.push_back(liveIn);
				}
			}
		}

		unsigned liveInSize = curr->liveIn.size();

		// Update block liveIn list
		curr->liveIn.clear();

		// Add all liveOut variables that are not defined by current block
		for(unsigned i = 0; i < curr->liveOut.size(); i++)
		{
			if(curr->liveOut[i]->parent != curr)
			{
				assert(!curr->liveIn.contains(curr->liveOut[i]));
				curr->liveIn.push_back(curr->liveOut[i]);
			}
		}

		// Add all arguments from phi isntructions and all arguments that are not defined in current block
		for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
		{
			for(unsigned i = 0; i < inst->arguments.size(); i++)
			{
				if(VmInstruction *argument = getType<VmInstruction>(inst->arguments[i]))
				{
					if(inst->cmd == VM_INST_PHI)
					{
						if(!curr->liveIn.contains(inst))
							curr->liveIn.push_back(inst);
					}
					else
					{
						if(argument->parent != curr)
						{
							if(!curr->liveIn.contains(argument))
								curr->liveIn.push_back(argument);
						}
					}
				}
			}
		}

		if(liveInSize != curr->liveIn.size())
		{
			for(unsigned i = 0; i < curr->predecessors.size(); i++)
			{
				VmBlock *predecessor = curr->predecessors[i];

				if(!worklist.contains(predecessor))
					worklist.push_back(predecessor);
			}
		}
	}
}